

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O1

word Nf_MatchDeref_rec(Nf_Man_t *p,int i,int c,Nf_Mat_t *pM)

{
  uint *puVar1;
  void *pvVar2;
  int *piVar3;
  word wVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  word *pwVar8;
  int iVar9;
  byte bVar10;
  word wVar11;
  bool bVar12;
  
  uVar5 = *(uint *)pM;
  if (-1 < (int)uVar5) {
    __assert_fail("pM->fBest",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                  ,0x6a1,"word Nf_MatchDeref_rec(Nf_Man_t *, int, int, Nf_Mat_t *)");
  }
  if ((uVar5 >> 0x1e & 1) == 0) {
    if ((i < 0) || ((p->vCutSets).nSize <= i)) {
LAB_0077faaf:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    iVar9 = (p->vCutSets).pArray[(uint)i];
    if (iVar9 == 0) {
      return 0;
    }
    uVar7 = iVar9 >> 0x10;
    if (((int)uVar7 < 0) || ((p->vPages).nSize <= (int)uVar7)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    uVar5 = uVar5 >> 0x14 & 0x3ff;
    if (uVar5 == 0) {
      __assert_fail("h > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                    ,0x94,"int *Nf_CutFromHandle(int *, int)");
    }
    pvVar2 = (p->vPages).pArray[uVar7];
    bVar10 = 0;
    if ((*(byte *)((long)pvVar2 + (ulong)uVar5 * 4 + (ulong)(ushort)iVar9 * 4) & 0x1f) == 0) {
      wVar11 = 0;
    }
    else {
      puVar1 = (uint *)((long)pvVar2 + (ulong)uVar5 * 4 + (ulong)(ushort)iVar9 * 4);
      wVar11 = 0;
      uVar5 = 0;
      do {
        uVar7 = puVar1[(ulong)(((uint)pM->Cfg >> 8) >> (bVar10 & 0x1f) & 0xf) + 1];
        if ((ulong)uVar7 == 0) break;
        bVar12 = (((uint)pM->Cfg >> 1 & 0x7f) >> (uVar5 & 0x1f) & 1) != 0;
        if ((int)uVar7 < 0) goto LAB_0077face;
        uVar6 = (uint)bVar12 + uVar7 * 2;
        if ((p->vMapRefs).nSize <= (int)uVar6) goto LAB_0077faaf;
        piVar3 = (p->vMapRefs).pArray;
        iVar9 = piVar3[uVar6];
        if (iVar9 < 1) {
          __assert_fail("Nf_ObjMapRefNum(p, iVar, fCompl) > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                        ,0x6ae,"word Nf_MatchDeref_rec(Nf_Man_t *, int, int, Nf_Mat_t *)");
        }
        iVar9 = iVar9 + -1;
        piVar3[uVar6] = iVar9;
        if (iVar9 == 0) {
          wVar4 = Nf_MatchDeref_rec(p,uVar7,(uint)bVar12,p->pNfObjs[uVar7].M[bVar12]);
          wVar11 = wVar11 + wVar4;
        }
        uVar5 = uVar5 + 1;
        bVar10 = bVar10 + 4;
      } while (uVar5 < (*puVar1 & 0x1f));
    }
    pwVar8 = (word *)((long)p->pCells->iDelays + ((ulong)((*(uint *)pM & 0xfffff) * 0x50) - 0x14));
  }
  else {
    if (i < 0) {
LAB_0077face:
      __assert_fail("Var >= 0 && !(c >> 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                    ,0x12e,"int Abc_Var2Lit(int, int)");
    }
    uVar5 = (uint)(c == 0) + i * 2;
    if ((p->vMapRefs).nSize <= (int)uVar5) goto LAB_0077faaf;
    piVar3 = (p->vMapRefs).pArray;
    iVar9 = piVar3[uVar5];
    if (iVar9 < 1) {
      __assert_fail("Nf_ObjMapRefNum(p, i, !c) > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                    ,0x6a4,"word Nf_MatchDeref_rec(Nf_Man_t *, int, int, Nf_Mat_t *)");
    }
    iVar9 = iVar9 + -1;
    piVar3[uVar5] = iVar9;
    if (iVar9 == 0) {
      wVar11 = Nf_MatchDeref_rec(p,i,(uint)(c == 0),p->pNfObjs[(uint)i].M[c == 0]);
    }
    else {
      wVar11 = 0;
    }
    pwVar8 = &p->InvAreaW;
  }
  return wVar11 + *pwVar8;
}

Assistant:

word Nf_MatchDeref_rec( Nf_Man_t * p, int i, int c, Nf_Mat_t * pM )
{
    word Area = 0;
    int k, iVar, fCompl, * pCut;
    assert( pM->fBest );
    if ( pM->fCompl )
    {
        assert( Nf_ObjMapRefNum(p, i, !c) > 0 );
        if ( !Nf_ObjMapRefDec(p, i, !c) )
            Area += Nf_MatchDeref_rec( p, i, !c, Nf_ObjMatchD(p, i, !c) );
        return Area + p->InvAreaW;
    }
    if ( Nf_ObjCutSetId(p, i) == 0 )
        return 0;
    pCut = Nf_CutFromHandle( Nf_ObjCutSet(p, i), pM->CutH );
    Nf_CutForEachVarCompl( pCut, pM->Cfg, iVar, fCompl, k )
    {
        assert( Nf_ObjMapRefNum(p, iVar, fCompl) > 0 );
        if ( !Nf_ObjMapRefDec(p, iVar, fCompl) )
            Area += Nf_MatchDeref_rec( p, iVar, fCompl, Nf_ObjMatchD(p, iVar, fCompl) );
    }
    return Area + Nf_ManCell(p, pM->Gate)->AreaW;
}